

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

UInt32 CrcUpdateT8(UInt32 v,void *data,size_t size,UInt32 *table)

{
  uint uVar1;
  uint uVar2;
  uint *puStack_30;
  UInt32 d;
  Byte *p;
  UInt32 *table_local;
  size_t size_local;
  void *data_local;
  UInt32 v_local;
  
  puStack_30 = (uint *)data;
  data_local._4_4_ = v;
  for (table_local = (UInt32 *)size; table_local != (UInt32 *)0x0 && ((ulong)puStack_30 & 7) != 0;
      table_local = (UInt32 *)((long)table_local + -1)) {
    data_local._4_4_ = table[(data_local._4_4_ ^ (byte)*puStack_30) & 0xff] ^ data_local._4_4_ >> 8;
    puStack_30 = (uint *)((long)puStack_30 + 1);
  }
  for (; (UInt32 *)0x7 < table_local; table_local = table_local + -2) {
    uVar2 = *puStack_30 ^ data_local._4_4_;
    uVar1 = puStack_30[1];
    data_local._4_4_ =
         table[(uVar1 & 0xff) + 0x300] ^ table[(uVar1 >> 8 & 0xff) + 0x200] ^
         table[(uVar1 >> 0x10 & 0xff) + 0x100] ^ table[uVar1 >> 0x18] ^
         table[(uVar2 & 0xff) + 0x700] ^ table[(uVar2 >> 8 & 0xff) + 0x600] ^
         table[(uVar2 >> 0x10 & 0xff) + 0x500] ^ table[(uVar2 >> 0x18) + 0x400];
    puStack_30 = puStack_30 + 2;
  }
  for (; table_local != (UInt32 *)0x0; table_local = (UInt32 *)((long)table_local + -1)) {
    data_local._4_4_ = table[(data_local._4_4_ ^ (byte)*puStack_30) & 0xff] ^ data_local._4_4_ >> 8;
    puStack_30 = (uint *)((long)puStack_30 + 1);
  }
  return data_local._4_4_;
}

Assistant:

static UInt32 MY_FAST_CALL CrcUpdateT8(UInt32 v, const void *data, size_t size, const UInt32 *table)
{
  const Byte *p = (const Byte *)data;
  for (; size > 0 && ((unsigned)(ptrdiff_t)p & 7) != 0; size--, p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  for (; size >= 8; size -= 8, p += 8)
  {
    UInt32 d;
    v ^= *(const UInt32 *)p;
    v =
          table[0x700 + ((v      ) & 0xFF)]
        ^ table[0x600 + ((v >>  8) & 0xFF)]
        ^ table[0x500 + ((v >> 16) & 0xFF)]
        ^ table[0x400 + ((v >> 24))];
    d = *((const UInt32 *)p + 1);
    v ^=
          table[0x300 + ((d      ) & 0xFF)]
        ^ table[0x200 + ((d >>  8) & 0xFF)]
        ^ table[0x100 + ((d >> 16) & 0xFF)]
        ^ table[0x000 + ((d >> 24))];
  }
  for (; size > 0; size--, p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  return v;
}